

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_test.cc
# Opt level: O2

int main(void)

{
  uint __line;
  ConcreteMediator *this;
  Colleague *c;
  undefined8 *puVar1;
  undefined8 *puVar2;
  char *__assertion;
  
  this = (ConcreteMediator *)operator_new(0x20);
  (this->super_Mediator)._vptr_Mediator = (_func_int **)&PTR_add_00103d48;
  (this->colleagues).super__Vector_base<Colleague_*,_std::allocator<Colleague_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colleagues).super__Vector_base<Colleague_*,_std::allocator<Colleague_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colleagues).super__Vector_base<Colleague_*,_std::allocator<Colleague_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c = (Colleague *)operator_new(0x18);
  c->mediator = (Mediator *)this;
  c->value = 0;
  c->_vptr_Colleague = (_func_int **)&PTR_gossip_00103d90;
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[1] = this;
  *(undefined4 *)(puVar1 + 2) = 0;
  *puVar1 = &PTR_gossip_00103d90;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = this;
  *(undefined4 *)(puVar2 + 2) = 0;
  *puVar2 = &PTR_gossip_00103d90;
  ConcreteMediator::add(this,c);
  (**(this->super_Mediator)._vptr_Mediator)(this,puVar1);
  (**(this->super_Mediator)._vptr_Mediator)(this,puVar2);
  (**c->_vptr_Colleague)(c,10);
  if (c->value == 10) {
    if (*(int *)(puVar1 + 2) == 10) {
      if (*(int *)(puVar2 + 2) == 10) {
        (**c->_vptr_Colleague)(c,0x58);
        if (c->value == 0x58) {
          if (*(int *)(puVar1 + 2) == 0x58) {
            if (*(int *)(puVar2 + 2) == 0x58) {
              return 0;
            }
            __assertion = "value_c3 == 88";
            __line = 0x20;
          }
          else {
            __assertion = "value_c2 == 88";
            __line = 0x1f;
          }
        }
        else {
          __assertion = "value_c1 == 88";
          __line = 0x1e;
        }
      }
      else {
        __assertion = "value_c3 == 10";
        __line = 0x18;
      }
    }
    else {
      __assertion = "value_c2 == 10";
      __line = 0x17;
    }
  }
  else {
    __assertion = "value_c1 == 10";
    __line = 0x16;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/mediator_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {
  Mediator* mediator = new ConcreteMediator;

  Colleague* c1 = new ConcreteColleague(mediator);
  Colleague* c2 = new ConcreteColleague(mediator);
  Colleague* c3 = new ConcreteColleague(mediator);

  mediator->add(c1);
  mediator->add(c2);
  mediator->add(c3);

  c1->gossip(10);
  int value_c1 = c1->getValue();
  int value_c2 = c2->getValue();
  int value_c3 = c3->getValue();
  assert(value_c1 == 10);
  assert(value_c2 == 10);
  assert(value_c3 == 10);

  c1->gossip(88);
  value_c1 = c1->getValue();
  value_c2 = c2->getValue();
  value_c3 = c3->getValue();
  assert(value_c1 == 88);
  assert(value_c2 == 88);
  assert(value_c3 == 88);
}